

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemanager.c
# Opt level: O0

csafestring_t * filemanager_calculateCompilationPath(ctemplate_t *ctemplate,char *templateFile)

{
  csafestring_t *str;
  char *pcVar1;
  csafestring_t *in_RSI;
  char *suffix;
  csafestring_t *compilationPath;
  csafestring_t *in_stack_ffffffffffffffe0;
  
  str = safe_clone(in_stack_ffffffffffffffe0);
  safe_strcat(in_RSI,(char *)str);
  pcVar1 = filemanager_getSuffix((char *)str);
  *pcVar1 = 's';
  pcVar1[1] = 'o';
  pcVar1[2] = '\0';
  return str;
}

Assistant:

csafestring_t *filemanager_calculateCompilationPath(ctemplate_t *ctemplate, char *templateFile) {
	csafestring_t *compilationPath = safe_clone(ctemplate->workingBaseDir);
	safe_strcat(compilationPath, templateFile);

	char *suffix = filemanager_getSuffix(compilationPath->data);
	*suffix = 's';
	*( suffix + 1 ) = 'o';
	*( suffix + 2 ) = '\0';

	return compilationPath;
}